

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_os_rename(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  char *ptr;
  char *__new;
  ulong uVar2;
  JSValueUnion JVar3;
  int64_t iVar4;
  JSValue JVar5;
  
  ptr = JS_ToCString(ctx,*argv);
  iVar4 = 6;
  if (ptr != (char *)0x0) {
    __new = JS_ToCString(ctx,argv[1]);
    if (__new != (char *)0x0) {
      iVar1 = rename(ptr,__new);
      uVar2 = js_get_errno((long)iVar1);
      JS_FreeCString(ctx,ptr);
      JS_FreeCString(ctx,__new);
      JVar3.ptr = (void *)(uVar2 & 0xffffffff);
      iVar4 = 0;
      goto LAB_001108de;
    }
    JS_FreeCString(ctx,ptr);
  }
  JVar3.float64 = 0.0;
LAB_001108de:
  JVar5.tag = iVar4;
  JVar5.u.ptr = JVar3.ptr;
  return JVar5;
}

Assistant:

static JSValue js_os_rename(JSContext *ctx, JSValueConst this_val,
                            int argc, JSValueConst *argv)
{
    const char *oldpath, *newpath;
    int ret;
    
    oldpath = JS_ToCString(ctx, argv[0]);
    if (!oldpath)
        return JS_EXCEPTION;
    newpath = JS_ToCString(ctx, argv[1]);
    if (!newpath) {
        JS_FreeCString(ctx, oldpath);
        return JS_EXCEPTION;
    }
    ret = js_get_errno(rename(oldpath, newpath));
    JS_FreeCString(ctx, oldpath);
    JS_FreeCString(ctx, newpath);
    return JS_NewInt32(ctx, ret);
}